

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O0

void aom_highbd_h_predictor_4x4_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  uint16_t *puVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  __m128i row3;
  __m128i row2;
  __m128i row1;
  __m128i row0;
  __m128i left_u16;
  int bd_local;
  uint16_t *left_local;
  uint16_t *above_local;
  ptrdiff_t stride_local;
  uint16_t *dst_local;
  
  uVar2 = *(ulong *)left;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar2;
  auVar3 = pshuflw(auVar3,auVar3,0);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar2;
  auVar4 = pshuflw(auVar4,auVar4,0x55);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar2;
  auVar5 = pshuflw(auVar5,auVar5,0xaa);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar2;
  auVar6 = pshuflw(auVar6,auVar6,0xff);
  local_e8 = auVar3._0_8_;
  *(undefined8 *)dst = local_e8;
  puVar1 = dst + stride;
  local_f8 = auVar4._0_8_;
  *(undefined8 *)puVar1 = local_f8;
  local_108 = auVar5._0_8_;
  *(undefined8 *)(puVar1 + stride) = local_108;
  local_118 = auVar6._0_8_;
  *(undefined8 *)(puVar1 + stride + stride) = local_118;
  return;
}

Assistant:

void aom_highbd_h_predictor_4x4_sse2(uint16_t *dst, ptrdiff_t stride,
                                     const uint16_t *above,
                                     const uint16_t *left, int bd) {
  const __m128i left_u16 = _mm_loadl_epi64((const __m128i *)left);
  const __m128i row0 = _mm_shufflelo_epi16(left_u16, 0x0);
  const __m128i row1 = _mm_shufflelo_epi16(left_u16, 0x55);
  const __m128i row2 = _mm_shufflelo_epi16(left_u16, 0xaa);
  const __m128i row3 = _mm_shufflelo_epi16(left_u16, 0xff);
  (void)above;
  (void)bd;
  _mm_storel_epi64((__m128i *)dst, row0);
  dst += stride;
  _mm_storel_epi64((__m128i *)dst, row1);
  dst += stride;
  _mm_storel_epi64((__m128i *)dst, row2);
  dst += stride;
  _mm_storel_epi64((__m128i *)dst, row3);
}